

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O3

void __thiscall CMU462::HalfedgeMesh::computeCatmullClarkPositions(HalfedgeMesh *this)

{
  return;
}

Assistant:

void HalfedgeMesh::computeCatmullClarkPositions()
  {
    // TODO The implementation for this routine should be
    // a lot like HalfedgeMesh::computeLinearSubdivisionPositions(),
    // except that the calculation of the positions themsevles is
    // slightly more involved, using the Catmull-Clark subdivision
    // rules.  (These rules are outlined in the Developer Manual.)

    // TODO face

    // TODO edges

    // TODO vertices
  }